

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1533.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  CURL *curl_00;
  int local_3c;
  CURLcode res;
  CURL *curl;
  cb_data data;
  char *URL_local;
  
  data.remaining_bytes = (size_t)URL;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    curl_00 = (CURL *)curl_easy_init();
    if (curl_00 == (CURL *)0x0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      reset_data((cb_data *)&curl,curl_00);
      local_3c = curl_easy_setopt(curl_00,0x2712,data.remaining_bytes);
      if ((((((local_3c == 0) && (local_3c = curl_easy_setopt(curl_00,0x2f,1), local_3c == 0)) &&
            (local_3c = curl_easy_setopt(curl_00,0x75a8,data._8_8_), local_3c == 0)) &&
           ((local_3c = curl_easy_setopt(curl_00,0x29,1), local_3c == 0 &&
            (local_3c = curl_easy_setopt(curl_00,0x4e2c,read_callback), local_3c == 0)))) &&
          ((local_3c = curl_easy_setopt(curl_00,0x2719,&curl), local_3c == 0 &&
           ((local_3c = curl_easy_setopt(curl_00,0x4e2b,write_callback), local_3c == 0 &&
            (local_3c = curl_easy_setopt(curl_00,0x2711,&curl), local_3c == 0)))))) &&
         (local_3c = perform_and_check_connections
                               (curl_00,"First request without CURLOPT_KEEP_SENDING_ON_ERROR",1),
         local_3c == 0x78)) {
        reset_data((cb_data *)&curl,curl_00);
        local_3c = perform_and_check_connections
                             (curl_00,"Second request without CURLOPT_KEEP_SENDING_ON_ERROR",1);
        if ((local_3c == 0x78) && (local_3c = curl_easy_setopt(curl_00,0xf5,1), local_3c == 0)) {
          reset_data((cb_data *)&curl,curl_00);
          local_3c = perform_and_check_connections
                               (curl_00,"First request with CURLOPT_KEEP_SENDING_ON_ERROR",1);
          if (local_3c == 0x78) {
            reset_data((cb_data *)&curl,curl_00);
            local_3c = perform_and_check_connections
                                 (curl_00,"Second request with CURLOPT_KEEP_SENDING_ON_ERROR",0);
            if (local_3c == 0x78) {
              local_3c = 0x78;
            }
          }
        }
      }
      curl_easy_cleanup(curl_00);
      curl_global_cleanup();
      URL_local._4_4_ = local_3c;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  struct cb_data data;
  CURL *curl = NULL;
  CURLcode res = CURLE_FAILED_INIT;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(curl == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  reset_data(&data, curl);

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_POST, 1L);
  test_setopt(curl, CURLOPT_POSTFIELDSIZE_LARGE,
              (curl_off_t)data.remaining_bytes);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);
  test_setopt(curl, CURLOPT_READDATA, &data);
  test_setopt(curl, CURLOPT_WRITEFUNCTION, write_callback);
  test_setopt(curl, CURLOPT_WRITEDATA, &data);

  res = perform_and_check_connections(curl,
    "First request without CURLOPT_KEEP_SENDING_ON_ERROR", 1);
  if(res != TEST_ERR_SUCCESS) {
    goto test_cleanup;
  }

  reset_data(&data, curl);

  res = perform_and_check_connections(curl,
    "Second request without CURLOPT_KEEP_SENDING_ON_ERROR", 1);
  if(res != TEST_ERR_SUCCESS) {
    goto test_cleanup;
  }

  test_setopt(curl, CURLOPT_KEEP_SENDING_ON_ERROR, 1L);

  reset_data(&data, curl);

  res = perform_and_check_connections(curl,
    "First request with CURLOPT_KEEP_SENDING_ON_ERROR", 1);
  if(res != TEST_ERR_SUCCESS) {
    goto test_cleanup;
  }

  reset_data(&data, curl);

  res = perform_and_check_connections(curl,
    "Second request with CURLOPT_KEEP_SENDING_ON_ERROR", 0);
  if(res != TEST_ERR_SUCCESS) {
    goto test_cleanup;
  }

  res = TEST_ERR_SUCCESS;

test_cleanup:

  curl_easy_cleanup(curl);

  curl_global_cleanup();

  return (int)res;
}